

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pending-c.cpp
# Opt level: O2

void duckdb_destroy_pending(duckdb_pending_result *pending_result)

{
  duckdb_pending_result this;
  pointer this_00;
  
  if ((pending_result != (duckdb_pending_result *)0x0) &&
     (this = *pending_result, this != (duckdb_pending_result)0x0)) {
    if ((_Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
         )*(tuple<duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_> *)
           this !=
        (_Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
         )0x0) {
      this_00 = duckdb::
                unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                              *)this);
      duckdb::PendingQueryResult::Close(this_00);
    }
    std::unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>::
    ~unique_ptr((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
                 *)this);
    operator_delete(this);
    *pending_result = (duckdb_pending_result)0x0;
  }
  return;
}

Assistant:

void duckdb_destroy_pending(duckdb_pending_result *pending_result) {
	if (!pending_result || !*pending_result) {
		return;
	}
	auto wrapper = reinterpret_cast<PendingStatementWrapper *>(*pending_result);
	if (wrapper->statement) {
		wrapper->statement->Close();
	}
	delete wrapper;
	*pending_result = nullptr;
}